

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_je_free_sized(void *ptr,size_t size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = __tls_get_addr(&PTR_024e0b60);
  if (size < 0x1001) {
    uVar4 = (ulong)duckdb_je_sz_size2index_tab[size + 7 >> 3];
    uVar3 = duckdb_je_sz_index2size_tab[uVar4] + *(long *)(lVar2 + 0x350);
    if ((uVar3 < *(ulong *)(lVar2 + 0x358)) &&
       (lVar1 = *(long *)(lVar2 + 0x368 + uVar4 * 0x18),
       *(short *)(lVar2 + 0x37a + uVar4 * 0x18) != (short)lVar1)) {
      *(long *)(lVar2 + uVar4 * 0x18 + 0x368) = lVar1 + -8;
      *(void **)(lVar1 + -8) = ptr;
      *(ulong *)(lVar2 + 0x350) = uVar3;
      return;
    }
  }
  duckdb_je_sdallocx_default(ptr,size,0);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_free_sized(void *ptr, size_t size) {
	LOG("core.free_sized.entry", "ptr: %p, size: %zu", ptr, size);

	je_sdallocx_noflags(ptr, size);

	LOG("core.free_sized.exit", "");
}